

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Generators<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> * __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>
           *__return_storage_ptr__,Generators *this,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *val,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators_1,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators_2)

{
  long lVar1;
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> local_30;
  
  local_30.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
        )operator_new(0x20);
  *(undefined ***)
   local_30.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_00318e80;
  lVar1 = *(long *)(this + 8);
  *(long *)((long)local_30.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_false>
                  ._M_head_impl + 8) = *(long *)this;
  *(long *)((long)local_30.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_false>
                  ._M_head_impl + 0x10) = lVar1;
  *(long *)((long)local_30.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_false>
                  ._M_head_impl + 0x18) = *(long *)(this + 0x10);
  Generators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>
            ((Generators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>> *)
             __return_storage_ptr__,&local_30,val,moreGenerators,moreGenerators_1);
  if (local_30.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_30.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }